

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
gl4cts::TextureFilterMinmaxUtils::getDataFromTexture
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TextureFilterMinmaxUtils *this,RenderContext *context,GLuint textureId,IVec2 *textureSize,
          GLenum format,GLenum type)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  int *piVar6;
  reference pvVar7;
  GLsizei imageLength;
  Functions *gl;
  GLenum format_local;
  IVec2 *textureSize_local;
  GLuint textureId_local;
  RenderContext *context_local;
  TextureFilterMinmaxUtils *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *data;
  long lVar5;
  
  iVar3 = (*context->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  piVar6 = tcu::Vector<int,_2>::x(textureSize);
  iVar3 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::y(textureSize);
  iVar1 = *piVar6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,(long)(iVar3 * iVar1));
  (**(code **)(lVar5 + 0xb8))(0xde1,textureId);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"bindTexture error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1de);
  pcVar2 = *(code **)(lVar5 + 0xaa0);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (__return_storage_ptr__,0);
  (*pcVar2)(0xde1,0,format,type,pvVar7);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"getTexImage error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1e1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<glw::GLuint> TextureFilterMinmaxUtils::getDataFromTexture(const glu::RenderContext& context,
																	  glw::GLuint textureId, tcu::IVec2 textureSize,
																	  glw::GLenum format, glw::GLenum type)
{
	const glw::Functions& gl = context.getFunctions();

	glw::GLsizei imageLength = textureSize.x() * textureSize.y();

	std::vector<glw::GLuint> data;
	data.resize(imageLength);

	gl.bindTexture(GL_TEXTURE_2D, textureId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindTexture error occurred");

	gl.getTexImage(GL_TEXTURE_2D, 0, format, type, &data[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getTexImage error occurred");

	return data;
}